

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::emit_dqt(jpeg_encoder *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  long lVar5;
  undefined8 uStack_38;
  
  bVar2 = 1;
  lVar4 = 0;
  uStack_38 = in_RAX;
  do {
    emit_marker(this,0xdb);
    emit_word(this,0x43);
    uStack_38._0_7_ = CONCAT16((char)lVar4,(undefined6)uStack_38);
    if (this->m_all_stream_writes_succeeded == true) {
      uVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 6,1);
    }
    else {
      uVar3 = 0;
    }
    this->m_all_stream_writes_succeeded = SUB41(uVar3,0);
    lVar5 = 0;
    do {
      uStack_38 = CONCAT17((char)this->m_quantization_tables[lVar4][lVar5],(undefined7)uStack_38);
      if ((uVar3 & 1) == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 7,1);
      }
      this->m_all_stream_writes_succeeded = SUB41(uVar3,0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
    lVar4 = 1;
    bVar1 = (bool)(this->m_num_components == '\x03' & bVar2);
    bVar2 = 0;
  } while (bVar1);
  return;
}

Assistant:

void jpeg_encoder::emit_dqt()
	{
		for (int i = 0; i < ((m_num_components == 3) ? 2 : 1); i++)
		{
			emit_marker(M_DQT);
			emit_word(64 + 1 + 2);
			emit_byte(static_cast<uint8>(i));
			for (int j = 0; j < 64; j++)
				emit_byte(static_cast<uint8>(m_quantization_tables[i][j]));
		}
	}